

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Zero_patch64(int g_a,int64_t *lo,int64_t *hi)

{
  Integer *hi_00;
  Integer *in_RDX;
  long in_RSI;
  int in_EDI;
  int i_1;
  int i;
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer ndim;
  Integer a;
  Integer in_stack_00000140;
  int local_b0;
  int local_ac;
  long local_a8 [8];
  long local_68 [8];
  long local_28;
  
  hi_00 = (Integer *)(long)in_EDI;
  local_28 = pnga_ndim(in_stack_00000140);
  for (local_ac = 0; local_ac < local_28; local_ac = local_ac + 1) {
    local_68[(local_28 - local_ac) + -1] = *(long *)(in_RSI + (long)local_ac * 8) + 1;
  }
  for (local_b0 = 0; local_b0 < local_28; local_b0 = local_b0 + 1) {
    local_a8[(local_28 - local_b0) + -1] = in_RDX[local_b0] + 1;
  }
  pnga_zero_patch(in_RSI,in_RDX,hi_00);
  return;
}

Assistant:

void NGA_Zero_patch64(int g_a, int64_t lo[], int64_t  hi[])
{
    Integer a=(Integer)g_a;
    Integer ndim = wnga_ndim(a);
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
    COPYINDEX_C2F(lo,_ga_lo, ndim);
    COPYINDEX_C2F(hi,_ga_hi, ndim);

    wnga_zero_patch(a, _ga_lo, _ga_hi);
}